

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O2

void __thiscall util_tests::util_ReplaceAll::test_method(util_ReplaceAll *this)

{
  long in_FS_OFFSET;
  anon_class_8_1_3a1eaf4f test_replaceall;
  string original;
  allocator<char> local_9b;
  allocator<char> local_9a;
  allocator<char> local_99;
  anon_class_8_1_3a1eaf4f local_98;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"A test \"%s\" string \'%s\'.",(allocator<char> *)&local_50);
  local_98.original = &local_30;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"",(allocator<char> *)&local_90);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"foo",&local_99);
  test_method::anon_class_8_1_3a1eaf4f::operator()(&local_98,&local_50,&local_70,&local_30);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"foo",(allocator<char> *)&local_90);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"foo",&local_99);
  test_method::anon_class_8_1_3a1eaf4f::operator()(&local_98,&local_30,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"%s",&local_99);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"foo",&local_9a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"A test \"foo\" string \'foo\'.",&local_9b);
  test_method::anon_class_8_1_3a1eaf4f::operator()(&local_98,&local_50,&local_70,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"\"",&local_99);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"foo",&local_9a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"A test foo%sfoo string \'%s\'.",&local_9b);
  test_method::anon_class_8_1_3a1eaf4f::operator()(&local_98,&local_50,&local_70,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"\'",&local_99);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"foo",&local_9a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"A test \"%s\" string foo%sfoo.",&local_9b);
  test_method::anon_class_8_1_3a1eaf4f::operator()(&local_98,&local_50,&local_70,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(util_ReplaceAll)
{
    const std::string original("A test \"%s\" string '%s'.");
    auto test_replaceall = [&original](const std::string& search, const std::string& substitute, const std::string& expected) {
        auto test = original;
        ReplaceAll(test, search, substitute);
        BOOST_CHECK_EQUAL(test, expected);
    };

    test_replaceall("", "foo", original);
    test_replaceall(original, "foo", "foo");
    test_replaceall("%s", "foo", "A test \"foo\" string 'foo'.");
    test_replaceall("\"", "foo", "A test foo%sfoo string '%s'.");
    test_replaceall("'", "foo", "A test \"%s\" string foo%sfoo.");
}